

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O3

void loadData(void)

{
  char cVar1;
  istream *piVar2;
  string line;
  ifstream ignoredUsersFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [65];
  
  std::ifstream::ifstream((istream *)local_228,"data/ignored_users.txt",_S_in);
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) + (char)(istream *)local_228
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_228,(string *)&local_248,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&ignoredUsers_abi_cxx11_,&local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void loadData() {
    std::ifstream ignoredUsersFile("data/ignored_users.txt");
    std::string line;
    while (std::getline(ignoredUsersFile, line)) {
        ignoredUsers.insert(line);
    }
}